

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O3

bool __thiscall QAccessibleCache::containsObject(QAccessibleCache *this,QObject *obj)

{
  bool bVar1;
  QMetaObject *pQVar2;
  iterator iVar3;
  iterator iVar4;
  pair<unsigned_int,_const_QMetaObject_*> *ppVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> local_48;
  QObject *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = obj;
  if (obj != (QObject *)0x0) {
    pQVar2 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj);
    QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
              (&local_48,
               (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20),
               &local_30);
    iVar3 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin(&local_48);
    iVar4 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end(&local_48);
    if (iVar3.i == iVar4.i) {
      bVar1 = true;
    }
    else {
      do {
        ppVar5 = iVar3.i + 1;
        bVar6 = (iVar3.i)->second == pQVar2;
        bVar1 = !bVar6;
        if (bVar6) break;
        iVar3.i = ppVar5;
      } while (ppVar5 != iVar4.i);
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    bVar6 = true;
    if (!bVar1) goto LAB_005876a8;
  }
  bVar6 = false;
LAB_005876a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QAccessibleCache::containsObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return true;
            }
        }
    }
    return false;
}